

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglversionfunctionsfactory.cpp
# Opt level: O1

QAbstractOpenGLFunctions *
QOpenGLVersionFunctionsFactory::get(QOpenGLVersionProfile *versionProfile,QOpenGLContext *context)

{
  Span *pSVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  OpenGLContextProfile OVar6;
  pair<int,_int> pVar7;
  QOpenGLContextVersionData *pQVar8;
  pair<int,_int> pVar9;
  QOpenGLFunctions_4_5_Compatibility *this;
  QOpenGLContext *pQVar10;
  QOpenGLVersionProfile QVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  const_iterator cVar13;
  QAbstractOpenGLFunctions *funcs;
  QOpenGLVersionProfile vp;
  QSurfaceFormat f;
  QOpenGLVersionProfile local_50;
  QOpenGLVersionProfile local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (context == (QOpenGLContext *)0x0) {
    context = (QOpenGLContext *)QOpenGLContext::currentContext();
  }
  if (context == (QOpenGLContext *)0x0) {
    get();
  }
  else {
    cVar2 = QOpenGLContext::isOpenGLES();
    if (cVar2 == '\0') {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QOpenGLContext::format();
      local_48.d = (QOpenGLVersionProfilePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QOpenGLVersionProfile::QOpenGLVersionProfile(&local_48,versionProfile);
      bVar3 = QOpenGLVersionProfile::isValid(&local_48);
      if (!bVar3) {
        QOpenGLVersionProfile::QOpenGLVersionProfile(&local_50,(QSurfaceFormat *)&local_40);
        QOpenGLVersionProfile::operator=(&local_48,&local_50);
        QOpenGLVersionProfile::~QOpenGLVersionProfile(&local_50);
      }
      iVar4 = QSurfaceFormat::majorVersion();
      iVar5 = QSurfaceFormat::minorVersion();
      pVar7 = QOpenGLVersionProfile::version(&local_48);
      if (((iVar4 < pVar7.first) || ((iVar4 <= pVar7.first && (iVar5 < pVar7.second)))) ||
         ((((bVar3 = QOpenGLVersionProfile::hasProfiles(&local_48), bVar3 &&
            (OVar6 = QOpenGLVersionProfile::profile(&local_48), OVar6 != CoreProfile)) ||
           (bVar3 = QOpenGLVersionProfile::isLegacyVersion(&local_48), bVar3)) &&
          (iVar4 = QSurfaceFormat::profile(), iVar4 == 1)))) {
        QVar11.d = (QOpenGLVersionProfilePrivate *)(QOpenGLFunctions_4_5_Compatibility *)0x0;
      }
      else {
        local_50.d = (QOpenGLVersionProfilePrivate *)0x0;
        pQVar8 = QOpenGLContextVersionData::forContext(context);
        cVar13 = QHash<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*>::
                 constFindImpl<QOpenGLVersionProfile>(&pQVar8->functions,&local_48);
        if (cVar13.i.d ==
            (Data<QHashPrivate::Node<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*>_> *)0x0 &&
            cVar13.i.bucket == 0) {
          pVar7 = QOpenGLVersionProfile::version(&local_48);
          pVar9 = QOpenGLVersionProfile::version(&local_48);
          uVar12 = (ulong)pVar9 >> 0x20;
          bVar3 = QOpenGLVersionProfile::hasProfiles(&local_48);
          iVar4 = pVar7.first;
          if (bVar3) {
            OVar6 = QOpenGLVersionProfile::profile(&local_48);
            if (OVar6 == CompatibilityProfile) {
              if (uVar12 == 5 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xd8);
                QOpenGLFunctions_4_5_Compatibility::QOpenGLFunctions_4_5_Compatibility(this);
              }
              else if (uVar12 == 4 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(200);
                QOpenGLFunctions_4_4_Compatibility::QOpenGLFunctions_4_4_Compatibility
                          ((QOpenGLFunctions_4_4_Compatibility *)this);
              }
              else if (uVar12 == 3 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(200);
                QOpenGLFunctions_4_3_Compatibility::QOpenGLFunctions_4_3_Compatibility
                          ((QOpenGLFunctions_4_3_Compatibility *)this);
              }
              else if (uVar12 == 2 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xc0);
                QOpenGLFunctions_4_2_Compatibility::QOpenGLFunctions_4_2_Compatibility
                          ((QOpenGLFunctions_4_2_Compatibility *)this);
              }
              else if (uVar12 == 1 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xb8);
                QOpenGLFunctions_4_1_Compatibility::QOpenGLFunctions_4_1_Compatibility
                          ((QOpenGLFunctions_4_1_Compatibility *)this);
              }
              else if (uVar12 == 0 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xb0);
                QOpenGLFunctions_4_0_Compatibility::QOpenGLFunctions_4_0_Compatibility
                          ((QOpenGLFunctions_4_0_Compatibility *)this);
              }
              else if (iVar4 == 3 && uVar12 == 3) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xa8);
                QOpenGLFunctions_3_3_Compatibility::QOpenGLFunctions_3_3_Compatibility
                          ((QOpenGLFunctions_3_3_Compatibility *)this);
              }
              else {
                if (uVar12 != 2 || iVar4 != 3) goto LAB_00169960;
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xa0);
                QOpenGLFunctions_3_2_Compatibility::QOpenGLFunctions_3_2_Compatibility
                          ((QOpenGLFunctions_3_2_Compatibility *)this);
              }
            }
            else if (OVar6 == CoreProfile) {
              if (uVar12 == 5 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xa0);
                QOpenGLFunctions_4_5_Core::QOpenGLFunctions_4_5_Core
                          ((QOpenGLFunctions_4_5_Core *)this);
              }
              else if (uVar12 == 4 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x98);
                QOpenGLFunctions_4_4_Core::QOpenGLFunctions_4_4_Core
                          ((QOpenGLFunctions_4_4_Core *)this);
              }
              else if (uVar12 == 3 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x90);
                QOpenGLFunctions_4_3_Core::QOpenGLFunctions_4_3_Core
                          ((QOpenGLFunctions_4_3_Core *)this);
              }
              else if (uVar12 == 2 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x88);
                QOpenGLFunctions_4_2_Core::QOpenGLFunctions_4_2_Core
                          ((QOpenGLFunctions_4_2_Core *)this);
              }
              else if (uVar12 == 1 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x80);
                QOpenGLFunctions_4_1_Core::QOpenGLFunctions_4_1_Core
                          ((QOpenGLFunctions_4_1_Core *)this);
              }
              else if (uVar12 == 0 && iVar4 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x78);
                QOpenGLFunctions_4_0_Core::QOpenGLFunctions_4_0_Core
                          ((QOpenGLFunctions_4_0_Core *)this);
              }
              else if (iVar4 == 3 && uVar12 == 3) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x70);
                QOpenGLFunctions_3_3_Core::QOpenGLFunctions_3_3_Core
                          ((QOpenGLFunctions_3_3_Core *)this);
              }
              else {
                if (uVar12 != 2 || iVar4 != 3) goto LAB_00169960;
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x68);
                QOpenGLFunctions_3_2_Core::QOpenGLFunctions_3_2_Core
                          ((QOpenGLFunctions_3_2_Core *)this);
              }
            }
            else {
LAB_00169960:
              this = (QOpenGLFunctions_4_5_Compatibility *)0x0;
            }
          }
          else if (uVar12 == 1 && iVar4 == 3) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x60);
            QOpenGLFunctions_3_1::QOpenGLFunctions_3_1((QOpenGLFunctions_3_1 *)this);
          }
          else if (uVar12 == 0 && iVar4 == 3) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x90);
            QOpenGLFunctions_3_0::QOpenGLFunctions_3_0((QOpenGLFunctions_3_0 *)this);
          }
          else if (iVar4 == 2 && uVar12 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x80);
            QOpenGLFunctions_2_1::QOpenGLFunctions_2_1((QOpenGLFunctions_2_1 *)this);
          }
          else if (uVar12 == 0 && iVar4 == 2) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x78);
            QOpenGLFunctions_2_0::QOpenGLFunctions_2_0((QOpenGLFunctions_2_0 *)this);
          }
          else if (uVar12 == 5 && iVar4 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x68);
            QOpenGLFunctions_1_5::QOpenGLFunctions_1_5((QOpenGLFunctions_1_5 *)this);
          }
          else if (uVar12 == 4 && iVar4 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x60);
            QOpenGLFunctions_1_4::QOpenGLFunctions_1_4((QOpenGLFunctions_1_4 *)this);
          }
          else if (uVar12 == 3 && iVar4 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x50);
            QOpenGLFunctions_1_3::QOpenGLFunctions_1_3((QOpenGLFunctions_1_3 *)this);
          }
          else if (uVar12 == 2 && iVar4 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x40);
            QOpenGLFunctions_1_2::QOpenGLFunctions_1_2((QOpenGLFunctions_1_2 *)this);
          }
          else if (uVar12 == 1 && iVar4 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x30);
            QOpenGLFunctions_1_1::QOpenGLFunctions_1_1((QOpenGLFunctions_1_1 *)this);
          }
          else {
            if (uVar12 != 0 || iVar4 != 1) goto LAB_00169960;
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x20);
            QOpenGLFunctions_1_0::QOpenGLFunctions_1_0((QOpenGLFunctions_1_0 *)this);
          }
          local_50.d = (QOpenGLVersionProfilePrivate *)this;
          if (this != (QOpenGLFunctions_4_5_Compatibility *)0x0) {
            QAbstractOpenGLFunctions::setOwningContext
                      (&this->super_QAbstractOpenGLFunctions,context);
            QHash<QOpenGLVersionProfile,QAbstractOpenGLFunctions*>::
            emplace<QAbstractOpenGLFunctions*const&>
                      ((QHash<QOpenGLVersionProfile,QAbstractOpenGLFunctions*> *)&pQVar8->functions,
                       &local_48,(QAbstractOpenGLFunctions **)&local_50);
          }
        }
        else {
          pSVar1 = (cVar13.i.d)->spans;
          uVar12 = cVar13.i.bucket >> 7;
          local_50.d = *(QOpenGLVersionProfilePrivate **)
                        (pSVar1[uVar12].entries
                         [pSVar1[uVar12].offsets[(uint)cVar13.i.bucket & 0x7f]].storage.data + 8);
        }
        QVar11.d = local_50.d;
        if (((QOpenGLFunctions_4_5_Compatibility *)local_50.d !=
             (QOpenGLFunctions_4_5_Compatibility *)0x0) &&
           (pQVar10 = (QOpenGLContext *)QOpenGLContext::currentContext(), QVar11.d = local_50.d,
           pQVar10 == context)) {
          (**(code **)(*(long *)local_50.d + 0x10))();
          QVar11.d = local_50.d;
        }
      }
      QOpenGLVersionProfile::~QOpenGLVersionProfile(&local_48);
      QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_40);
      goto LAB_001693bb;
    }
    get();
  }
  QVar11.d = (QOpenGLVersionProfilePrivate *)0x0;
LAB_001693bb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return &((QOpenGLFunctions_4_5_Compatibility *)QVar11.d)->super_QAbstractOpenGLFunctions;
}

Assistant:

QAbstractOpenGLFunctions *QOpenGLVersionFunctionsFactory::get(const QOpenGLVersionProfile &versionProfile, QOpenGLContext *context)
{
    if (!context)
        context = QOpenGLContext::currentContext();

    if (!context) {
        qWarning("versionFunctions: No OpenGL context");
        return nullptr;
    }

#if !QT_CONFIG(opengles2)
    if (context->isOpenGLES()) {
        qWarning("versionFunctions: Not supported on OpenGL ES");
        return nullptr;
    }
#endif // !QT_CONFIG(opengles2)

    const QSurfaceFormat f = context->format();

    // Ensure we have a valid version and profile. Default to context's if none specified
    QOpenGLVersionProfile vp = versionProfile;
    if (!vp.isValid())
        vp = QOpenGLVersionProfile(f);

    // Check that context is compatible with requested version
    const auto v = std::pair(f.majorVersion(), f.minorVersion());
    if (v < vp.version())
        return nullptr;

    // If this context only offers core profile functions then we can't create
    // function objects for legacy or compatibility profile requests
    if (((vp.hasProfiles() && vp.profile() != QSurfaceFormat::CoreProfile) || vp.isLegacyVersion())
        && f.profile() == QSurfaceFormat::CoreProfile)
        return nullptr;

    // Create object if suitable one not cached
    QAbstractOpenGLFunctions* funcs = nullptr;
    // TODO: replace with something else
    auto *data = QOpenGLContextVersionData::forContext(context);
    auto it = data->functions.constFind(vp);
    if (it == data->functions.constEnd()) {
        funcs = createFunctions(vp);
        if (funcs) {
            funcs->setOwningContext(context);
            data->functions.insert(vp, funcs);
        }
    } else {
        funcs = it.value();
    }

    if (funcs && QOpenGLContext::currentContext() == context)
        funcs->initializeOpenGLFunctions();

    return funcs;
}